

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ServiceDescriptor *desc)

{
  string *psVar1;
  string local_58;
  undefined1 local_38 [8];
  string classname;
  ServiceDescriptor *desc_local;
  
  classname.field_2._8_8_ = this;
  psVar1 = ServiceDescriptor::name_abi_cxx11_((ServiceDescriptor *)this);
  std::__cxx11::string::string((string *)local_38,(string *)psVar1);
  anon_unknown_2::ClassNamePrefix<google::protobuf::ServiceDescriptor>
            (&local_58,(string *)local_38,(ServiceDescriptor *)classname.field_2._8_8_);
  std::operator+(__return_storage_ptr__,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const ServiceDescriptor* desc) {
  std::string classname = desc->name();
  return ClassNamePrefix(classname, desc) + classname;
}